

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

result_t * exttposeFunc(result_t *__return_storage_ptr__,Env *env,ExttposeArgument *args)

{
  ostream *poVar1;
  void *pvVar2;
  long lVar3;
  string local_1c0 [32];
  string local_1a0 [35];
  undefined1 local_17d;
  undefined1 local_170 [8];
  Exttpose exttpose;
  ExttposeArgument *args_local;
  Env *env_local;
  result_t *result;
  
  exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)args;
  poVar1 = std::operator<<((ostream *)&env->logger,"CONF ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[0x43]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[0x44]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(float)exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage[0x45]);
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<
                             (poVar1,(float)exttpose.fidx.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage[0x46]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  if (*(char *)((long)exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0x109) != '\0') {
    std::operator<<((ostream *)&env->logger,"SEQ TURNED OFF and PARTITIONS = 1\n");
  }
  lVar3 = lround(*(double *)
                  (exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x38) *
                 (double)exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[0x43] + 0.5);
  *(long *)(exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage + 0x3a) = lVar3;
  if ((exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage[0x3f] == 0) &&
     (*(long *)(exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 0x3a) < 1)) {
    exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[0x3a] = 1;
    exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[0x3b] = 0;
  }
  poVar1 = std::operator<<((ostream *)&env->logger,"args.MINSUPPORT ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(long *)(exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x3a));
  poVar1 = std::operator<<(poVar1," ");
  pvVar2 = (void *)std::ostream::operator<<
                             (poVar1,exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage[0x43]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&env->summary,"TPOSE");
  if (*(char *)((long)exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0x109) != '\0') {
    std::operator<<((ostream *)&env->summary," DIFF");
  }
  if (exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[0x3e] != 0) {
    std::operator<<((ostream *)&env->summary," SEQ");
  }
  if (exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[0x3c] == 0) {
    std::operator<<((ostream *)&env->summary," NOINVERT");
  }
  if (exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[0x3d] == 0) {
    std::operator<<((ostream *)&env->summary," NOF2");
  }
  poVar1 = std::operator<<((ostream *)&env->summary," ");
  poVar1 = std::operator<<(poVar1,(string *)
                                  exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(double *)
                              (exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 0x38));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[0x43]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(long *)(exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x3a));
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<
            (poVar1,exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[0x41]);
  Exttpose::Exttpose((Exttpose *)local_170,env,
                     (ExttposeArgument *)
                     exttpose.fidx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  Exttpose::tpose((Exttpose *)local_170);
  local_17d = 0;
  result_t::result_t(__return_storage_ptr__);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->logger,local_1a0);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->summary,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  local_17d = 1;
  Exttpose::~Exttpose((Exttpose *)local_170);
  return __return_storage_ptr__;
}

Assistant:

result_t exttposeFunc(Env &env, ExttposeArgument &args) {
    env.logger << "CONF " << args.DBASE_NUM_TRANS << " " << args.DBASE_MAXITEM << " "
               << args.DBASE_AVG_TRANS_SZ << " " << args.DBASE_AVG_CUST_SZ << endl;

    if (args.use_diff) {
        env.logger << "SEQ TURNED OFF and PARTITIONS = 1\n";
    }

    args.MINSUPPORT = lround(args.MINSUP_PER * args.DBASE_NUM_TRANS + 0.5);

    //ensure that support is at least 2
    if (!args.write_only_fcnt && args.MINSUPPORT < 1) args.MINSUPPORT = 1;
    env.logger << "args.MINSUPPORT " << args.MINSUPPORT << " " << args.DBASE_NUM_TRANS << endl;

    env.summary << "TPOSE";
    if (args.use_diff) env.summary << " DIFF";
    if (args.use_seq) env.summary << " SEQ";
    if (!args.do_invert) env.summary << " NOINVERT";
    if (!args.do_l2) env.summary << " NOF2";
    env.summary << " " << args.input << " " << args.MINSUP_PER << " " << args.DBASE_NUM_TRANS << " "
                << args.MINSUPPORT << " " << args.num_partitions;

    Exttpose exttpose(env, args);
    exttpose.tpose();

    result_t result;
    result.logger = env.logger.str();
    result.summary = env.summary.str();
    return result;
}